

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidget.cpp
# Opt level: O2

QWidget * __thiscall
QWidgetPrivate::determineLastFocusChild(QWidgetPrivate *this,QWidget *noFurtherThan)

{
  QWidget *this_00;
  long lVar1;
  long lVar2;
  bool bVar3;
  QWidget *pQVar4;
  QWidget *pQVar5;
  QWidget *pQVar6;
  QWidget *child;
  long lVar7;
  QWidget *pQVar8;
  
  this_00 = *(QWidget **)&this->field_0x8;
  pQVar4 = deepestFocusProxy(this);
  if (pQVar4 == (QWidget *)0x0) {
    lVar1 = *(long *)(*(long *)&this_00->field_0x8 + 0x20);
    lVar2 = *(long *)(*(long *)&this_00->field_0x8 + 0x28);
    lVar7 = 0;
    while ((pQVar5 = this_00, lVar2 << 3 != lVar7 &&
           (((pQVar5 = *(QWidget **)(lVar1 + lVar7), pQVar5 == (QWidget *)0x0 ||
             ((*(byte *)(*(long *)&pQVar5->field_0x8 + 0x30) & 1) == 0)) ||
            (pQVar4 = QWidget::focusProxy(pQVar5), pQVar4 != this_00))))) {
      lVar7 = lVar7 + 8;
    }
  }
  else {
    bVar3 = QWidget::isAncestorOf(this_00,pQVar4);
    child = pQVar4;
    pQVar8 = pQVar4;
    pQVar5 = this_00;
    if (bVar3) {
      while ((child = *(QWidget **)(*(long *)(*(long *)(*(long *)&child->field_0x8 + 8) + 8) + 0x80)
             , pQVar5 = pQVar8, child != pQVar4 &&
             (bVar3 = QWidget::isAncestorOf(this_00,child), bVar3))) {
        pQVar5 = QWidget::window(child);
        pQVar6 = QWidget::window(pQVar4);
        if (child == noFurtherThan) {
          return pQVar8;
        }
        if (pQVar5 != pQVar6) {
          return pQVar8;
        }
        if ((child->data->field_0x10 & 0xf0) != 0) {
          pQVar8 = child;
        }
      }
    }
  }
  return pQVar5;
}

Assistant:

QWidget *QWidgetPrivate::determineLastFocusChild(QWidget *noFurtherThan)
{
    Q_Q(QWidget);
    // Since we need to repeat the same logic for both 'first' and 'second', we add a function
    // that determines the last focus child for a widget, taking proxies and compound widgets into
    // account. If the target is not a compound widget (it doesn't have a focus proxy that points
    // to a child), 'lastFocusChild' will be set to the target itself.
    QWidget *lastFocusChild = q;

    QWidget *focusProxy = deepestFocusProxy();
    if (!focusProxy) {
        // QTBUG-81097: Another case is possible here. We can have a child
        // widget, that sets its focusProxy() to the parent (target).
        // An example of such widget is a QLineEdit, nested into
        // a QAbstractSpinBox. In this case such widget should be considered
        // the last focus child.
        for (auto *object : std::as_const(q->children())) {
            QWidget *w = qobject_cast<QWidget *>(object);
            if (w && w->focusProxy() == q) {
                lastFocusChild = w;
                break;
            }
        }
    } else if (q->isAncestorOf(focusProxy)) {
        lastFocusChild = focusProxy;
        for (QWidget *focusNext = lastFocusChild->nextInFocusChain();
             focusNext != focusProxy && q->isAncestorOf(focusNext)
                          && focusNext->window() == focusProxy->window();
             focusNext = focusNext->nextInFocusChain()) {
            if (focusNext == noFurtherThan)
                break;
            if (focusNext->focusPolicy() != Qt::NoFocus)
                lastFocusChild = focusNext;
        }
    }
    return lastFocusChild;
}